

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strassen-lace.c
# Opt level: O0

void FastNaiveMatrixMultiply
               (REAL *C,REAL *A,REAL *B,uint MatrixSize,uint RowWidthC,uint RowWidthA,uint RowWidthB
               )

{
  double dVar1;
  REAL ARowValue;
  double dStack_b0;
  uint Products;
  REAL Sum7;
  REAL Sum6;
  REAL Sum5;
  REAL Sum4;
  REAL Sum3;
  REAL Sum2;
  REAL Sum1;
  REAL Sum0;
  REAL FirstARowValue;
  REAL *BColumnStart;
  REAL *ARowStart;
  uint Vertical;
  uint Horizontal;
  PTR RowIncrementC;
  PTR MatrixWidthInBytes;
  PTR RowWidthAInBytes;
  PTR RowWidthBInBytes;
  uint RowWidthA_local;
  uint RowWidthC_local;
  uint MatrixSize_local;
  REAL *B_local;
  REAL *A_local;
  REAL *C_local;
  
  BColumnStart = A;
  A_local = C;
  for (ARowStart._0_4_ = 0; (uint)ARowStart < MatrixSize; ARowStart._0_4_ = (uint)ARowStart + 1) {
    for (ARowStart._4_4_ = 0; ARowStart._4_4_ < MatrixSize; ARowStart._4_4_ = ARowStart._4_4_ + 8) {
      FirstARowValue = (REAL)(B + ARowStart._4_4_);
      dStack_b0 = *BColumnStart;
      Sum1 = dStack_b0 * *(double *)FirstARowValue;
      Sum2 = dStack_b0 * *(double *)((long)FirstARowValue + 8);
      Sum3 = dStack_b0 * *(double *)((long)FirstARowValue + 0x10);
      Sum4 = dStack_b0 * *(double *)((long)FirstARowValue + 0x18);
      Sum5 = dStack_b0 * *(double *)((long)FirstARowValue + 0x20);
      Sum6 = dStack_b0 * *(double *)((long)FirstARowValue + 0x28);
      Sum7 = dStack_b0 * *(double *)((long)FirstARowValue + 0x30);
      dStack_b0 = dStack_b0 * *(double *)((long)FirstARowValue + 0x38);
      for (ARowValue._4_4_ = 1; BColumnStart = BColumnStart + 1, ARowValue._4_4_ < MatrixSize;
          ARowValue._4_4_ = ARowValue._4_4_ + 1) {
        dVar1 = *BColumnStart;
        FirstARowValue = (REAL)((long)FirstARowValue + (ulong)(RowWidthB << 3));
        Sum1 = dVar1 * *(double *)FirstARowValue + Sum1;
        Sum2 = dVar1 * *(double *)((long)FirstARowValue + 8) + Sum2;
        Sum3 = dVar1 * *(double *)((long)FirstARowValue + 0x10) + Sum3;
        Sum4 = dVar1 * *(double *)((long)FirstARowValue + 0x18) + Sum4;
        Sum5 = dVar1 * *(double *)((long)FirstARowValue + 0x20) + Sum5;
        Sum6 = dVar1 * *(double *)((long)FirstARowValue + 0x28) + Sum6;
        Sum7 = dVar1 * *(double *)((long)FirstARowValue + 0x30) + Sum7;
        dStack_b0 = dVar1 * *(double *)((long)FirstARowValue + 0x38) + dStack_b0;
      }
      BColumnStart = (REAL *)((long)BColumnStart - (ulong)(MatrixSize << 3));
      *A_local = Sum1;
      A_local[1] = Sum2;
      A_local[2] = Sum3;
      A_local[3] = Sum4;
      A_local[4] = Sum5;
      A_local[5] = Sum6;
      A_local[6] = Sum7;
      A_local[7] = dStack_b0;
      A_local = A_local + 8;
    }
    BColumnStart = (REAL *)((long)BColumnStart + (ulong)(RowWidthA << 3));
    A_local = (REAL *)((long)A_local + (ulong)((RowWidthC - MatrixSize) * 8));
  }
  return;
}

Assistant:

void FastNaiveMatrixMultiply(REAL *C, REAL *A, REAL *B,
        unsigned MatrixSize,
        unsigned RowWidthC,
        unsigned RowWidthA,
        unsigned RowWidthB
        )
{ 
    /* Assumes size of real is 8 bytes */
    PTR RowWidthBInBytes = RowWidthB  << 3;
    PTR RowWidthAInBytes = RowWidthA << 3;
    PTR MatrixWidthInBytes = MatrixSize << 3;
    PTR RowIncrementC = ( RowWidthC - MatrixSize) << 3;
    unsigned Horizontal, Vertical;
#ifdef DEBUG_ON
    REAL *OLDC = C;
    REAL *TEMPMATRIX;
#endif

    REAL *ARowStart = A;
    for (Vertical = 0; Vertical < MatrixSize; Vertical++) {
        for (Horizontal = 0; Horizontal < MatrixSize; Horizontal += 8) {
            REAL *BColumnStart = B + Horizontal;
            REAL FirstARowValue = *ARowStart++;

            REAL Sum0 = FirstARowValue * (*BColumnStart);
            REAL Sum1 = FirstARowValue * (*(BColumnStart+1));
            REAL Sum2 = FirstARowValue * (*(BColumnStart+2));
            REAL Sum3 = FirstARowValue * (*(BColumnStart+3));
            REAL Sum4 = FirstARowValue * (*(BColumnStart+4));
            REAL Sum5 = FirstARowValue * (*(BColumnStart+5));
            REAL Sum6 = FirstARowValue * (*(BColumnStart+6));
            REAL Sum7 = FirstARowValue * (*(BColumnStart+7));	

            unsigned Products;
            for (Products = 1; Products < MatrixSize; Products++) {
                REAL ARowValue = *ARowStart++;
                BColumnStart = (REAL*) (((PTR) BColumnStart) + RowWidthBInBytes);

                Sum0 += ARowValue * (*BColumnStart);
                Sum1 += ARowValue * (*(BColumnStart+1));
                Sum2 += ARowValue * (*(BColumnStart+2));
                Sum3 += ARowValue * (*(BColumnStart+3));
                Sum4 += ARowValue * (*(BColumnStart+4));
                Sum5 += ARowValue * (*(BColumnStart+5));
                Sum6 += ARowValue * (*(BColumnStart+6));
                Sum7 += ARowValue * (*(BColumnStart+7));	
            }
            ARowStart = (REAL*) ( ((PTR) ARowStart) - MatrixWidthInBytes);

            *(C) = Sum0;
            *(C+1) = Sum1;
            *(C+2) = Sum2;
            *(C+3) = Sum3;
            *(C+4) = Sum4;
            *(C+5) = Sum5;
            *(C+6) = Sum6;
            *(C+7) = Sum7;
            C+=8;
        }

        ARowStart = (REAL*) ( ((PTR) ARowStart) + RowWidthAInBytes );
        C = (REAL*) ( ((PTR) C) + RowIncrementC );
    }

}